

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix4f>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,matrix4f *v)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined8 local_ed;
  undefined8 uStack_e5;
  undefined8 local_dd;
  undefined8 uStack_d5;
  undefined8 local_cd;
  undefined8 uStack_c5;
  undefined8 local_bd;
  undefined8 uStack_b5;
  optional<tinyusdz::value::matrix4f> local_ac;
  undefined8 local_65;
  undefined8 uStack_5d;
  undefined8 local_55;
  undefined8 uStack_4d;
  undefined8 local_45;
  undefined8 uStack_3d;
  undefined8 local_35;
  undefined8 uStack_2d;
  
  if (v == (matrix4f *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_value<tinyusdz::value::matrix4f>(&local_ac,this);
    if (local_ac.has_value_ == true) {
      local_35 = local_ac.contained._48_8_;
      uStack_2d = local_ac.contained._56_8_;
      local_45 = local_ac.contained._32_8_;
      uStack_3d = local_ac.contained._40_8_;
      local_55 = local_ac.contained._16_8_;
      uStack_4d = local_ac.contained._24_8_;
      local_65 = local_ac.contained._0_8_;
      uStack_5d = local_ac.contained._8_8_;
      local_ed = local_ac.contained._0_8_;
      uStack_e5 = local_ac.contained._8_8_;
      local_dd = local_ac.contained._16_8_;
      uStack_d5 = local_ac.contained._24_8_;
      local_cd = local_ac.contained._32_8_;
      uStack_c5 = local_ac.contained._40_8_;
      local_bd = local_ac.contained._48_8_;
      uStack_b5 = local_ac.contained._56_8_;
    }
    if (local_ac.has_value_ != false) goto LAB_0039a0bc;
    if ((this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
  }
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = tinyusdz::value::TimeSamples::get<tinyusdz::value::matrix4f,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  if ((this->_blocked != false) ||
     (((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 0)) &&
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 1)))))) {
    get_value<tinyusdz::value::matrix4f>(&local_ac,this);
    if (local_ac.has_value_ == true) {
      local_ed = local_ac.contained._0_8_;
      uStack_e5 = local_ac.contained._8_8_;
      local_dd = local_ac.contained._16_8_;
      uStack_d5 = local_ac.contained._24_8_;
      local_cd = local_ac.contained._32_8_;
      uStack_c5 = local_ac.contained._40_8_;
      local_bd = local_ac.contained._48_8_;
      uStack_b5 = local_ac.contained._56_8_;
    }
    if (local_ac.has_value_ != false) {
LAB_0039a0bc:
      *(undefined8 *)v->m[3] = local_bd;
      *(undefined8 *)(v->m[3] + 2) = uStack_b5;
      *(undefined8 *)v->m[2] = local_cd;
      *(undefined8 *)(v->m[2] + 2) = uStack_c5;
      *(undefined8 *)v->m[1] = local_dd;
      *(undefined8 *)(v->m[1] + 2) = uStack_d5;
      *(undefined8 *)v->m[0] = local_ed;
      *(undefined8 *)(v->m[0] + 2) = uStack_e5;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }